

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

void __thiscall duckdb::DataTable::SetTableName(DataTable *this,string *new_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DataTableInfo *this_00;
  string local_30;
  
  this_00 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  local_30._M_dataplus._M_p = (new_name->_M_dataplus)._M_p;
  paVar1 = &new_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == paVar1) {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_30.field_2._8_8_ = *(undefined8 *)((long)&new_name->field_2 + 8);
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  }
  else {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_30._M_string_length = new_name->_M_string_length;
  (new_name->_M_dataplus)._M_p = (pointer)paVar1;
  new_name->_M_string_length = 0;
  (new_name->field_2)._M_local_buf[0] = '\0';
  DataTableInfo::SetTableName(this_00,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DataTable::SetTableName(string new_name) {
	info->SetTableName(std::move(new_name));
}